

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_properties(PROPERTIES_HANDLE properties)

{
  PROPERTIES_INSTANCE *properties_instance;
  AMQP_VALUE result;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance = (PROPERTIES_INSTANCE *)0x0;
  }
  else {
    properties_instance = (PROPERTIES_INSTANCE *)amqpvalue_clone(properties->composite_value);
  }
  return (AMQP_VALUE)properties_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_properties(PROPERTIES_HANDLE properties)
{
    AMQP_VALUE result;

    if (properties == NULL)
    {
        result = NULL;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        result = amqpvalue_clone(properties_instance->composite_value);
    }

    return result;
}